

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsStatus.cpp
# Opt level: O3

HighsStatus
interpretCallStatus(HighsLogOptions *log_options,HighsStatus call_status,
                   HighsStatus from_return_status,string *message)

{
  pointer pcVar1;
  HighsStatus HVar2;
  string local_48;
  
  if (call_status != kOk) {
    pcVar1 = (message->_M_dataplus)._M_p;
    highsStatusToString_abi_cxx11_(&local_48,call_status);
    highsLogDev(log_options,kWarning,"%s return of HighsStatus::%s\n",pcVar1,
                local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  HVar2 = (HighsStatus)(from_return_status == kWarning || call_status == kWarning);
  if (from_return_status == kError) {
    HVar2 = kError;
  }
  if (call_status == kError) {
    HVar2 = kError;
  }
  return HVar2;
}

Assistant:

HighsStatus interpretCallStatus(const HighsLogOptions log_options,
                                const HighsStatus call_status,
                                const HighsStatus from_return_status,
                                const std::string& message) {
  HighsStatus to_return_status;
  to_return_status = worseStatus(call_status, from_return_status);
  if (call_status != HighsStatus::kOk)
    highsLogDev(log_options, HighsLogType::kWarning,
                "%s return of HighsStatus::%s\n", message.c_str(),
                highsStatusToString(call_status).c_str());
  return to_return_status;
}